

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_FEA_loads_statics.cpp
# Opt level: O3

MyLoadCustom * __thiscall test_1::MyLoadCustom::Clone(MyLoadCustom *this)

{
  long lVar1;
  undefined8 uVar2;
  ChObj *this_00;
  
  this_00 = (ChObj *)operator_new(0x60);
  chrono::ChObj::ChObj(this_00,(ChObj *)this);
  *(undefined **)this_00 = &std::bad_alloc::typeinfo;
  uVar2 = *(undefined8 *)&this->field_0x40;
  *(undefined8 *)(this_00 + 0x38) = *(undefined8 *)&this->field_0x38;
  *(undefined8 *)(this_00 + 0x40) = uVar2;
  lVar1 = *(long *)&this->field_0x48;
  *(long *)(this_00 + 0x48) = lVar1;
  if (lVar1 != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
    }
  }
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)(this_00 + 0x50),
             (DenseStorage<double,__1,__1,_1,_0> *)&this->field_0x50);
  *(undefined ***)this_00 = &PTR__ChLoadCustom_00139468;
  return (MyLoadCustom *)this_00;
}

Assistant:

virtual MyLoadCustom* Clone() const override { return new MyLoadCustom(*this); }